

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O3

void spell_crushing_hand(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = number_percent();
  bVar1 = saves_spell(level + 1,(CHAR_DATA *)vo,0x10);
  act("$n creates a huge spectral hand to brutally pummel $N!",ch,(void *)0x0,vo,1);
  act("$n creates a huge spectral hand to brutally pummel you!",ch,(void *)0x0,vo,2);
  act("You create a huge spectral hand to brutally pummel $N!",ch,(void *)0x0,vo,3);
  iVar3 = number_percent();
  if (iVar3 < 0x3c) {
    act("$N appears to be stunned by the blow.",ch,(void *)0x0,vo,1);
    act("You feel stunned by the brutal blow.",ch,(void *)0x0,vo,2);
    act("$N appears to be stunned by the blow.",ch,(void *)0x0,vo,3);
    LAG_CHAR((CHAR_DATA *)vo,0x18);
  }
  iVar3 = iVar2 / 2 + 100;
  if (!bVar1) {
    iVar3 = iVar2 / 2 + 0xa0;
  }
  damage_old(ch,(CHAR_DATA *)vo,iVar3,sn,1,true);
  return;
}

Assistant:

void spell_crushing_hand(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	int dam;
	dam = 160;

	dam += (number_percent()) / 2;

	if (saves_spell(level + 1, victim, DAM_OTHER))
		dam -= 60;

	act("$n creates a huge spectral hand to brutally pummel $N!", ch, 0, victim, TO_NOTVICT);
	act("$n creates a huge spectral hand to brutally pummel you!", ch, 0, victim, TO_VICT);
	act("You create a huge spectral hand to brutally pummel $N!", ch, 0, victim, TO_CHAR);

	if (number_percent() < 60)
	{
		act("$N appears to be stunned by the blow.", ch, 0, victim, TO_NOTVICT);
		act("You feel stunned by the brutal blow.", ch, 0, victim, TO_VICT);
		act("$N appears to be stunned by the blow.", ch, 0, victim, TO_CHAR);
		LAG_CHAR(victim, PULSE_VIOLENCE * 2);
	}

	damage_old(ch, victim, dam, sn, DAM_BASH, true);
}